

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

void capnp::anon_unknown_1::enumerateDeps
               (Reader node,
               set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *deps)

{
  uint *puVar1;
  Reader type;
  undefined8 uVar2;
  bool bVar3;
  Which WVar4;
  Which WVar5;
  Iterator IVar6;
  Iterator IVar7;
  Iterator IVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar9;
  uint64_t local_360;
  _Base_ptr local_358;
  undefined1 local_350;
  uint64_t local_348;
  undefined1 local_340 [8];
  Reader method;
  undefined1 local_300 [8];
  Iterator __end3_2;
  undefined1 local_2e0 [8];
  Iterator __begin3_2;
  Reader *__range3_2;
  uint64_t local_288;
  undefined1 local_280 [8];
  Reader superclass;
  undefined1 local_240 [8];
  Iterator __end3_1;
  undefined1 local_220 [8];
  Iterator __begin3_1;
  Reader *__range3_1;
  Reader interfaceNode;
  uint64_t local_198;
  _Base_ptr local_190;
  undefined1 local_188;
  Reader local_180;
  uint64_t local_150;
  Reader local_148;
  Reader local_118;
  undefined1 local_e8 [8];
  Reader field;
  undefined1 local_a8 [8];
  Iterator __end3;
  undefined1 local_88 [8];
  Iterator __begin3;
  Reader *__range3;
  Reader structNode;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *deps_local;
  
  structNode._reader._40_8_ = deps;
  WVar4 = capnp::schema::Node::Reader::which(&node);
  if (WVar4 == STRUCT) {
    capnp::schema::Node::Reader::getStruct((Reader *)&__range3,&node);
    puVar1 = &__begin3.index;
    capnp::schema::Node::Struct::Reader::getFields((Reader *)puVar1,(Reader *)&__range3);
    IVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3._8_8_ = IVar6.container;
    __begin3.container._0_4_ = IVar6.index;
    local_88 = (undefined1  [8])__end3._8_8_;
    IVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    field._reader._40_8_ = IVar6.container;
    __end3.container._0_4_ = IVar6.index;
    local_a8 = (undefined1  [8])field._reader._40_8_;
    while (bVar3 = _::
                   IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                 *)local_88,
                                (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                 *)local_a8), bVar3) {
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
      ::operator*((Reader *)local_e8,
                  (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                   *)local_88);
      WVar5 = capnp::schema::Field::Reader::which((Reader *)local_e8);
      uVar2 = structNode._reader._40_8_;
      if (WVar5 == SLOT) {
        capnp::schema::Field::Reader::getSlot(&local_148,(Reader *)local_e8);
        capnp::schema::Field::Slot::Reader::getType(&local_118,&local_148);
        type._reader.capTable = local_118._reader.capTable;
        type._reader.segment = local_118._reader.segment;
        type._reader.data = local_118._reader.data;
        type._reader.pointers = local_118._reader.pointers;
        type._reader.dataSize = local_118._reader.dataSize;
        type._reader.pointerCount = local_118._reader.pointerCount;
        type._reader._38_2_ = local_118._reader._38_2_;
        type._reader.nestingLimit = local_118._reader.nestingLimit;
        type._reader._44_4_ = local_118._reader._44_4_;
        enumerateDeps(type,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)structNode._reader._40_8_);
      }
      else if (WVar5 == GROUP) {
        capnp::schema::Field::Reader::getGroup(&local_180,(Reader *)local_e8);
        local_150 = capnp::schema::Field::Group::Reader::getTypeId(&local_180);
        pVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)uVar2,&local_150);
        local_190 = (_Base_ptr)pVar9.first._M_node;
        local_188 = pVar9.second;
      }
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                    *)local_88);
    }
    bVar3 = capnp::schema::Node::Struct::Reader::getIsGroup((Reader *)&__range3);
    uVar2 = structNode._reader._40_8_;
    if (bVar3) {
      local_198 = capnp::schema::Node::Reader::getScopeId(&node);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 uVar2,&local_198);
    }
  }
  else if (WVar4 == INTERFACE) {
    capnp::schema::Node::Reader::getInterface((Reader *)&__range3_1,&node);
    puVar1 = &__begin3_1.index;
    capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)puVar1,(Reader *)&__range3_1);
    IVar7 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3_1._8_8_ = IVar7.container;
    __begin3_1.container._0_4_ = IVar7.index;
    local_220 = (undefined1  [8])__end3_1._8_8_;
    IVar7 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    superclass._reader._40_8_ = IVar7.container;
    __end3_1.container._0_4_ = IVar7.index;
    local_240 = (undefined1  [8])superclass._reader._40_8_;
    while (bVar3 = _::
                   IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                                 *)local_220,
                                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                                 *)local_240), bVar3) {
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
      ::operator*((Reader *)local_280,
                  (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                   *)local_220);
      uVar2 = structNode._reader._40_8_;
      local_288 = capnp::schema::Superclass::Reader::getId((Reader *)local_280);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 uVar2,&local_288);
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                    *)local_220);
    }
    puVar1 = &__begin3_2.index;
    capnp::schema::Node::Interface::Reader::getMethods((Reader *)puVar1,(Reader *)&__range3_1);
    IVar8 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3_2._8_8_ = IVar8.container;
    __begin3_2.container._0_4_ = IVar8.index;
    local_2e0 = (undefined1  [8])__end3_2._8_8_;
    IVar8 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    method._reader._40_8_ = IVar8.container;
    __end3_2.container._0_4_ = IVar8.index;
    local_300 = (undefined1  [8])method._reader._40_8_;
    while (bVar3 = _::
                   IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                                 *)local_2e0,
                                (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                                 *)local_300), bVar3) {
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
      ::operator*((Reader *)local_340,
                  (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                   *)local_2e0);
      uVar2 = structNode._reader._40_8_;
      local_348 = capnp::schema::Method::Reader::getParamStructType((Reader *)local_340);
      pVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )uVar2,&local_348);
      uVar2 = structNode._reader._40_8_;
      local_358 = (_Base_ptr)pVar9.first._M_node;
      local_350 = pVar9.second;
      local_360 = capnp::schema::Method::Reader::getResultStructType((Reader *)local_340);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 uVar2,&local_360);
      _::
      IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                    *)local_2e0);
    }
  }
  return;
}

Assistant:

void enumerateDeps(schema::Node::Reader node, std::set<uint64_t>& deps) {
  switch (node.which()) {
    case schema::Node::STRUCT: {
      auto structNode = node.getStruct();
      for (auto field: structNode.getFields()) {
        switch (field.which()) {
          case schema::Field::SLOT:
            enumerateDeps(field.getSlot().getType(), deps);
            break;
          case schema::Field::GROUP:
            deps.insert(field.getGroup().getTypeId());
            break;
        }
      }
      if (structNode.getIsGroup()) {
        deps.insert(node.getScopeId());
      }
      break;
    }
    case schema::Node::INTERFACE: {
      auto interfaceNode = node.getInterface();
      for (auto superclass: interfaceNode.getSuperclasses()) {
        deps.insert(superclass.getId());
      }
      for (auto method: interfaceNode.getMethods()) {
        deps.insert(method.getParamStructType());
        deps.insert(method.getResultStructType());
      }
      break;
    }
    default:
      break;
  }
}